

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwapIJ.c
# Opt level: O0

void swap_ij_case2(word *f,int totalVars,int i,int j)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int forShift;
  int WORDS_IN_TT;
  int wj;
  int y;
  int x;
  word temp;
  word mask [6];
  int j_local;
  int i_local;
  int totalVars_local;
  word *f_local;
  
  memset(&temp,0,0x30);
  temp = 0xaaaaaaaaaaaaaaaa;
  mask[0] = 0xcccccccccccccccc;
  mask[1] = 0xf0f0f0f0f0f0f0f0;
  mask[2] = 0xff00ff00ff00ff00;
  mask[3] = 0xffff0000ffff0000;
  mask[4] = 0xffffffff00000000;
  iVar2 = Kit_TruthWordNum_64bit(totalVars);
  iVar3 = 1 << ((char)j - 6U & 0x1f);
  for (WORDS_IN_TT = iVar3; WORDS_IN_TT < iVar2; WORDS_IN_TT = iVar3 * 2 + WORDS_IN_TT) {
    for (wj = WORDS_IN_TT - iVar3; wj < WORDS_IN_TT; wj = wj + 1) {
      uVar1 = f[wj + iVar3];
      bVar4 = (byte)(1 << ((byte)i & 0x1f));
      f[wj + iVar3] =
           (f[wj + iVar3] & mask[(long)i + -1]) + ((f[wj] & mask[(long)i + -1]) >> (bVar4 & 0x3f));
      f[wj] = (f[wj] & (mask[(long)i + -1] ^ 0xffffffffffffffff)) +
              ((uVar1 & (mask[(long)i + -1] ^ 0xffffffffffffffff)) << (bVar4 & 0x3f));
    }
  }
  return;
}

Assistant:

void swap_ij_case2( word* f,int totalVars, int i, int j)
{
    word mask[] = { ABC_CONST(0xAAAAAAAAAAAAAAAA), ABC_CONST(0xCCCCCCCCCCCCCCCC), ABC_CONST(0xF0F0F0F0F0F0F0F0),
                    ABC_CONST(0xFF00FF00FF00FF00), ABC_CONST(0xFFFF0000FFFF0000), ABC_CONST(0xFFFFFFFF00000000) };
    word temp;
    int x,y,wj;
    int WORDS_IN_TT = Kit_TruthWordNum_64bit(totalVars);
    //  int forShift = ((Word)1)<<i;
    int forShift = (1<<i);
    wj = 1 << (j - 6);
    x = 0;
    y = wj;
    for(y=wj; y<WORDS_IN_TT;y+=2*wj)
        for(x=y-wj; x < y; x++)
        {
            temp = f[x+wj];
            f[x+wj] = ((f[x+wj])&(mask[i])) + (((f[x]) & (mask[i])) >> forShift);
            f[x] = ((f[x])&(~mask[i])) + ((temp&(~mask[i])) << forShift);
        }
}